

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

void ngx_str_rbtree_insert_value
               (ngx_rbtree_node_t *temp,ngx_rbtree_node_t *node,ngx_rbtree_node_t *sentinel)

{
  int iVar1;
  ngx_rbtree_node_t **local_50;
  ngx_rbtree_node_t **local_48;
  ngx_rbtree_node_t **local_40;
  ngx_rbtree_node_t **local_38;
  ngx_rbtree_node_t **p;
  ngx_str_node_t *t;
  ngx_str_node_t *n;
  ngx_rbtree_node_t *sentinel_local;
  ngx_rbtree_node_t *node_local;
  ngx_rbtree_node_t *temp_local;
  
  node_local = temp;
  while( true ) {
    if (node->key == node_local->key) {
      if (node[1].key == node_local[1].key) {
        iVar1 = memcmp(node[1].left,node_local[1].left,node[1].key);
        if (iVar1 < 0) {
          local_50 = &node_local->left;
        }
        else {
          local_50 = &node_local->right;
        }
        local_38 = local_50;
      }
      else {
        if (node[1].key < node_local[1].key) {
          local_48 = &node_local->left;
        }
        else {
          local_48 = &node_local->right;
        }
        local_38 = local_48;
      }
    }
    else {
      if (node->key < node_local->key) {
        local_40 = &node_local->left;
      }
      else {
        local_40 = &node_local->right;
      }
      local_38 = local_40;
    }
    if (*local_38 == sentinel) break;
    node_local = *local_38;
  }
  *local_38 = node;
  node->parent = node_local;
  node->left = sentinel;
  node->right = sentinel;
  node->color = '\x01';
  return;
}

Assistant:

void
ngx_str_rbtree_insert_value(ngx_rbtree_node_t *temp,
    ngx_rbtree_node_t *node, ngx_rbtree_node_t *sentinel)
{
    ngx_str_node_t      *n, *t;
    ngx_rbtree_node_t  **p;

    for ( ;; ) {

        n = (ngx_str_node_t *) node;
        t = (ngx_str_node_t *) temp;

        if (node->key != temp->key) {

            p = (node->key < temp->key) ? &temp->left : &temp->right;

        } else if (n->str.len != t->str.len) {

            p = (n->str.len < t->str.len) ? &temp->left : &temp->right;

        } else {
            p = (ngx_memcmp(n->str.data, t->str.data, n->str.len) < 0)
                 ? &temp->left : &temp->right;
        }

        if (*p == sentinel) {
            break;
        }

        temp = *p;
    }

    *p = node;
    node->parent = temp;
    node->left = sentinel;
    node->right = sentinel;
    ngx_rbt_red(node);
}